

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O2

void bn_mont_reduction_u64(uint32_t len,uint64_t *n,uint64_t nInv,uint64_t *c,uint64_t *res)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  size_t __n;
  ulong uVar17;
  ulong uVar18;
  uint64_t *puVar19;
  long lVar20;
  ulong uVar21;
  undefined4 in_register_0000003c;
  uint64_t *puVar22;
  ulong uVar23;
  ulong uVar24;
  uint32_t i;
  uint64_t *os;
  long lVar25;
  ulong uVar26;
  void *__s;
  undefined8 uStack_70;
  ulong local_68;
  uint64_t *local_60;
  ulong local_58 [2];
  uint64_t *local_48;
  ulong local_40;
  size_t local_38;
  
  local_68 = CONCAT44(in_register_0000003c,len);
  local_58[0] = (ulong)(len >> 2);
  uVar26 = (ulong)len;
  local_48 = c + uVar26;
  local_58[1] = (ulong)(len & 0xfffffffc);
  puVar22 = c + 3;
  local_40 = 0;
  puVar19 = c;
  for (uVar21 = 0; uVar21 != uVar26; uVar21 = uVar21 + 1) {
    uVar23 = c[uVar21] * nInv;
    uVar24 = 0;
    for (lVar25 = 0; auVar12._8_8_ = 0, auVar12._0_8_ = uVar24, uVar17 = local_58[1],
        local_58[0] << 5 != lVar25; lVar25 = lVar25 + 0x20) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar23;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((long)n + lVar25);
      auVar12 = auVar2 * auVar7 + auVar12;
      uVar17 = auVar12._0_8_;
      puVar1 = (ulong *)((long)puVar22 + lVar25 + -0x18);
      uVar24 = *puVar1;
      *puVar1 = *puVar1 + uVar17;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = auVar12._8_8_ + (ulong)CARRY8(uVar24,uVar17);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar23;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)((long)n + lVar25 + 8);
      auVar13 = auVar3 * auVar8 + auVar13;
      uVar17 = auVar13._0_8_;
      puVar1 = (ulong *)((long)puVar22 + lVar25 + -0x10);
      uVar24 = *puVar1;
      *puVar1 = *puVar1 + uVar17;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = auVar13._8_8_ + (ulong)CARRY8(uVar24,uVar17);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar23;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)((long)n + lVar25 + 0x10);
      auVar14 = auVar4 * auVar9 + auVar14;
      uVar17 = auVar14._0_8_;
      puVar1 = (ulong *)((long)puVar22 + lVar25 + -8);
      uVar24 = *puVar1;
      *puVar1 = *puVar1 + uVar17;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = auVar14._8_8_ + (ulong)CARRY8(uVar24,uVar17);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar23;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)((long)n + lVar25 + 0x18);
      auVar15 = auVar5 * auVar10 + auVar15;
      uVar17 = auVar15._0_8_;
      puVar1 = (ulong *)((long)puVar22 + lVar25);
      uVar24 = *puVar1;
      *puVar1 = *puVar1 + uVar17;
      uVar24 = auVar15._8_8_ + (ulong)CARRY8(uVar24,uVar17);
    }
    for (; auVar16._8_8_ = 0, auVar16._0_8_ = uVar24, uVar17 < uVar26; uVar17 = uVar17 + 1) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar23;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = n[uVar17];
      auVar16 = auVar6 * auVar11 + auVar16;
      uVar18 = auVar16._0_8_;
      puVar1 = puVar19 + uVar17;
      uVar24 = *puVar1;
      *puVar1 = *puVar1 + uVar18;
      uVar24 = auVar16._8_8_ + (ulong)CARRY8(uVar24,uVar18);
    }
    uVar17 = (ulong)((char)local_40 != '\0');
    uVar23 = c[len + (int)uVar21];
    uVar18 = uVar24 + c[len + (int)uVar21];
    local_48[uVar21] = uVar18 + uVar17;
    local_40 = (ulong)(CARRY8(uVar24,uVar23) || CARRY8(uVar18,uVar17));
    puVar22 = puVar22 + 1;
    puVar19 = puVar19 + 1;
  }
  local_38 = uVar26 * 8;
  uStack_70 = 0x12ebc6;
  local_60 = res;
  memcpy(res,local_48,local_38);
  __n = local_38;
  lVar25 = -(uVar26 * 8 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_68 + lVar25);
  *(undefined8 *)((long)&uStack_70 + lVar25) = 0x12ebeb;
  memset(__s,0,__n);
  uVar21 = 0;
  for (lVar20 = 0; uVar23 = local_58[1], (local_58[0] & 0xffffffff) << 5 != lVar20;
      lVar20 = lVar20 + 0x20) {
    uVar23 = *(ulong *)((long)res + lVar20);
    uVar17 = (ulong)((char)uVar21 != '\0');
    uVar21 = *(ulong *)((long)n + lVar20);
    uVar18 = uVar23 - *(ulong *)((long)n + lVar20);
    *(ulong *)((long)__s + lVar20) = uVar18 - uVar17;
    uVar24 = *(ulong *)((long)res + lVar20 + 8);
    puVar1 = (ulong *)((long)n + lVar20 + 8);
    uVar17 = (ulong)(uVar23 < uVar21 || uVar18 < uVar17);
    uVar21 = *puVar1;
    uVar18 = uVar24 - *puVar1;
    *(ulong *)((long)&local_60 + lVar20 + lVar25) = uVar18 - uVar17;
    uVar23 = *(ulong *)((long)res + lVar20 + 0x10);
    puVar1 = (ulong *)((long)n + lVar20 + 0x10);
    uVar17 = (ulong)(uVar24 < uVar21 || uVar18 < uVar17);
    uVar21 = *puVar1;
    uVar18 = uVar23 - *puVar1;
    *(ulong *)((long)local_58 + lVar20 + lVar25) = uVar18 - uVar17;
    uVar24 = *(ulong *)((long)res + lVar20 + 0x18);
    puVar1 = (ulong *)((long)n + lVar20 + 0x18);
    uVar23 = (ulong)(uVar23 < uVar21 || uVar18 < uVar17);
    uVar21 = *puVar1;
    uVar17 = uVar24 - *puVar1;
    *(ulong *)((long)local_58 + lVar20 + lVar25 + 8) = uVar17 - uVar23;
    uVar21 = (ulong)(uVar24 < uVar21 || uVar17 < uVar23);
  }
  for (; uVar23 < uVar26; uVar23 = uVar23 + 1) {
    uVar24 = res[uVar23];
    uVar17 = (ulong)((char)uVar21 != '\0');
    uVar21 = n[uVar23];
    uVar18 = uVar24 - n[uVar23];
    *(ulong *)((long)__s + uVar23 * 8) = uVar18 - uVar17;
    uVar21 = (ulong)(uVar24 < uVar21 || uVar18 < uVar17);
  }
  for (uVar23 = 0; uVar26 != uVar23; uVar23 = uVar23 + 1) {
    res[uVar23] = *(ulong *)((long)__s + uVar23 * 8) & ~(local_40 - uVar21) |
                  res[uVar23] & local_40 - uVar21;
  }
  return;
}

Assistant:

static void
bn_mont_reduction_u64(uint32_t len, uint64_t *n, uint64_t nInv, uint64_t *c, uint64_t *res)
{
  uint64_t c0 = 0ULL;
  for (uint32_t i0 = 0U; i0 < len; i0++)
  {
    uint64_t qj = nInv * c[i0];
    uint64_t *res_j0 = c + i0;
    uint64_t c1 = 0ULL;
    for (uint32_t i = 0U; i < len / 4U; i++)
    {
      uint64_t a_i = n[4U * i];
      uint64_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i0);
      uint64_t a_i0 = n[4U * i + 1U];
      uint64_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i0, qj, c1, res_i1);
      uint64_t a_i1 = n[4U * i + 2U];
      uint64_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i1, qj, c1, res_i2);
      uint64_t a_i2 = n[4U * i + 3U];
      uint64_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i2, qj, c1, res_i);
    }
    for (uint32_t i = len / 4U * 4U; i < len; i++)
    {
      uint64_t a_i = n[i];
      uint64_t *res_i = res_j0 + i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i);
    }
    uint64_t r = c1;
    uint64_t c10 = r;
    uint64_t *resb = c + len + i0;
    uint64_t res_j = c[len + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u64(c0, c10, res_j, resb);
  }
  memcpy(res, c + len, (len + len - len) * sizeof (uint64_t));
  uint64_t c00 = c0;
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint64_t));
  uint64_t c1 = 0ULL;
  for (uint32_t i = 0U; i < len / 4U; i++)
  {
    uint64_t t1 = res[4U * i];
    uint64_t t20 = n[4U * i];
    uint64_t *res_i0 = tmp + 4U * i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t1, t20, res_i0);
    uint64_t t10 = res[4U * i + 1U];
    uint64_t t21 = n[4U * i + 1U];
    uint64_t *res_i1 = tmp + 4U * i + 1U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t10, t21, res_i1);
    uint64_t t11 = res[4U * i + 2U];
    uint64_t t22 = n[4U * i + 2U];
    uint64_t *res_i2 = tmp + 4U * i + 2U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t11, t22, res_i2);
    uint64_t t12 = res[4U * i + 3U];
    uint64_t t2 = n[4U * i + 3U];
    uint64_t *res_i = tmp + 4U * i + 3U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t12, t2, res_i);
  }
  for (uint32_t i = len / 4U * 4U; i < len; i++)
  {
    uint64_t t1 = res[i];
    uint64_t t2 = n[i];
    uint64_t *res_i = tmp + i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t1, t2, res_i);
  }
  uint64_t c10 = c1;
  uint64_t c2 = c00 - c10;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t *os = res;
    uint64_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;
  }
}